

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

void __thiscall NNTreeIterator::increment(NNTreeIterator *this,bool backward)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  uint uVar1;
  NNTreeDetails *pNVar2;
  QPDF *qpdf;
  uint uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long *plVar9;
  ulong uVar10;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *p_Var11;
  element_type *peVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint __len;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle pe_node;
  undefined1 local_108 [16];
  undefined1 local_f8 [56];
  uint local_c0;
  int local_bc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_a8;
  QPDFObjectHandle local_78;
  QPDFObjectHandle local_68;
  QPDF *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  ulong local_48;
  QPDFObjectHandle local_40;
  
  iVar6 = this->item_number;
  if (iVar6 < 0) {
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->impl->oh).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->impl->oh).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    deepen(this,&local_68,!backward,true);
    if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  else {
    local_48 = (ulong)!backward;
    local_bc = (uint)!backward * 4 + -2;
    local_f8._24_8_ = &this->node;
    local_50 = &(this->node).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    this_00 = &this->path;
    do {
      this->item_number = iVar6 + local_bc;
      (*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_f8 + 0x20),(string *)local_f8._24_8_);
      iVar6 = this->item_number;
      if ((iVar6 < 0) ||
         (iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_f8 + 0x20)),
         iVar7 <= iVar6)) {
        local_108._0_8_ = (element_type *)0x0;
        local_108._8_8_ = (NNTreeImpl *)0x0;
        (this->node).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_50,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
        this->item_number = -1;
        updateIValue(this,true);
        if ((NNTreeImpl *)local_108._8_8_ != (NNTreeImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        if ((this_00->
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
          do {
            getNextKid((NNTreeIterator *)local_108,(PathElement *)this,
                       (bool)((char)(this->path).
                                    super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev + '\x10'));
            bVar4 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_108);
            if (bVar4) {
              std::__cxx11::
              list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
              _M_erase(this_00,(this->path).
                               super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
              bVar4 = false;
            }
            else {
              local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_108._0_8_;
              local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
              if ((NNTreeImpl *)local_108._8_8_ != (NNTreeImpl *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
                }
              }
              bVar4 = deepen(this,&local_78,SUB81(local_48,0),false);
              if ((NNTreeImpl *)
                  local_78.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (NNTreeImpl *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            if ((NNTreeImpl *)local_108._8_8_ != (NNTreeImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
            }
          } while (bVar4 == false &&
                   (this_00->
                   super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                   )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00);
        }
      }
      if (this->item_number < 0) {
LAB_0012b4bf:
        bVar4 = false;
      }
      else {
        (*(code *)**(undefined8 **)this->impl->details)();
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_108,(string *)local_f8._24_8_);
        uVar13 = local_f8._40_8_;
        local_f8._40_8_ = local_108._8_8_;
        local_f8._32_8_ = local_108._0_8_;
        local_108._0_8_ = (element_type *)0x0;
        local_108._8_8_ = (NNTreeImpl *)0x0;
        if (((NNTreeImpl *)uVar13 != (NNTreeImpl *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13),
           (NNTreeImpl *)local_108._8_8_ != (NNTreeImpl *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        iVar6 = this->item_number;
        iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_f8 + 0x20));
        if (iVar7 <= iVar6 + 1) {
          qpdf = this->impl->qpdf;
          local_108._0_8_ = (element_type *)local_f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"items array doesn\'t have enough elements","");
          warn(qpdf,(QPDFObjectHandle *)local_f8._24_8_,(string *)local_108);
          uVar13 = local_f8._0_8_;
          uVar14 = local_108._0_8_;
          if ((element_type *)local_108._0_8_ != (element_type *)local_f8) {
LAB_0012b4b7:
            operator_delete((void *)uVar14,(ulong)((long)&((_List_node_base *)uVar13)->_M_next + 1))
            ;
          }
          goto LAB_0012b4bf;
        }
        pNVar2 = this->impl->details;
        QVar15 = QPDFObjectHandle::getArrayItem(&local_40,(int)local_f8 + 0x20);
        cVar5 = (**(code **)(*(long *)pNVar2 + 8))
                          (pNVar2,&local_40,
                           QVar15.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        bVar4 = true;
        if (cVar5 == '\0') {
          uVar1 = this->item_number;
          local_c0 = -uVar1;
          if (0 < (int)uVar1) {
            local_c0 = uVar1;
          }
          __len = 1;
          if (9 < local_c0) {
            uVar10 = (ulong)local_c0;
            uVar3 = 4;
            do {
              __len = uVar3;
              uVar8 = (uint)uVar10;
              if (uVar8 < 100) {
                __len = __len - 2;
                goto LAB_0012b353;
              }
              if (uVar8 < 1000) {
                __len = __len - 1;
                goto LAB_0012b353;
              }
              if (uVar8 < 10000) goto LAB_0012b353;
              uVar10 = uVar10 / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar8);
            __len = __len + 1;
          }
LAB_0012b353:
          local_58 = this->impl->qpdf;
          local_a8._16_8_ = (long)&local_a8 + 0x20;
          std::__cxx11::string::_M_construct
                    ((long)&local_a8 + 0x10,(char)__len - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_a8._16_8_ + (ulong)(uVar1 >> 0x1f)),__len,local_c0);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((long)&local_a8 + 0x10,0,(char *)0x0,0x27fdeb);
          local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
          p_Var11 = (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     *)(plVar9 + 2);
          if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               *)*plVar9 == p_Var11) {
            local_a8._0_8_ = *(undefined8 *)p_Var11;
            local_a8._8_8_ = plVar9[3];
          }
          else {
            local_a8._0_8_ = *(undefined8 *)p_Var11;
            local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar9;
          }
          local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
          *plVar9 = (long)p_Var11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
          peVar12 = (element_type *)(plVar9 + 2);
          if ((element_type *)*plVar9 == peVar12) {
            local_f8._0_8_ =
                 *(undefined8 *)
                  &(peVar12->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_f8._8_8_ = plVar9[3];
            local_108._0_8_ = (element_type *)local_f8;
          }
          else {
            local_f8._0_8_ =
                 *(undefined8 *)
                  &(peVar12->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_108._0_8_ = (element_type *)*plVar9;
          }
          local_108._8_8_ = plVar9[1];
          *plVar9 = (long)peVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          warn(local_58,(QPDFObjectHandle *)local_f8._24_8_,(string *)local_108);
          if ((element_type *)local_108._0_8_ != (element_type *)local_f8) {
            operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
          }
          if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               *)local_b8._M_pi != &local_a8) {
            operator_delete(local_b8._M_pi,local_a8._0_8_ + 1);
          }
          uVar13 = local_a8._32_8_;
          uVar14 = local_a8._16_8_;
          if ((element_type *)local_a8._16_8_ != (element_type *)((long)&local_a8 + 0x20))
          goto LAB_0012b4b7;
          goto LAB_0012b4bf;
        }
      }
      if ((NNTreeImpl *)local_f8._40_8_ != (NNTreeImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._40_8_);
      }
      iVar6 = this->item_number;
    } while (-1 < iVar6 && !bVar4);
  }
  return;
}

Assistant:

void
NNTreeIterator::increment(bool backward)
{
    if (this->item_number < 0) {
        QTC::TC("qpdf", "NNTree increment end()");
        deepen(impl.oh, !backward, true);
        return;
    }
    bool found_valid_key = false;
    while (valid() && (!found_valid_key)) {
        this->item_number += backward ? -2 : 2;
        auto items = this->node.getKey(impl.details.itemsKey());
        if ((this->item_number < 0) || (this->item_number >= items.getArrayNItems())) {
            bool found = false;
            setItemNumber(QPDFObjectHandle(), -1);
            while (!(found || this->path.empty())) {
                auto& element = this->path.back();
                auto pe_node = getNextKid(element, backward);
                if (pe_node.isNull()) {
                    this->path.pop_back();
                } else {
                    found = deepen(pe_node, !backward, false);
                }
            }
        }
        if (this->item_number >= 0) {
            items = this->node.getKey(impl.details.itemsKey());
            if (this->item_number + 1 >= items.getArrayNItems()) {
                QTC::TC("qpdf", "NNTree skip item at end of short items");
                warn(impl.qpdf, this->node, "items array doesn't have enough elements");
            } else if (!impl.details.keyValid(items.getArrayItem(this->item_number))) {
                QTC::TC("qpdf", "NNTree skip invalid key");
                warn(
                    impl.qpdf,
                    this->node,
                    ("item " + std::to_string(this->item_number) + " has the wrong type"));
            } else {
                found_valid_key = true;
            }
        }
    }
}